

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O1

void __thiscall DIS::FastEntityStatePdu::FastEntityStatePdu(FastEntityStatePdu *this)

{
  EntityInformationFamilyPdu::EntityInformationFamilyPdu(&this->super_EntityInformationFamilyPdu);
  (this->super_EntityInformationFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__FastEntityStatePdu_001b4bc8;
  *(undefined8 *)&(this->super_EntityInformationFamilyPdu).super_Pdu.super_PduSuperclass.field_0x14
       = 0;
  this->_entityKind = '\0';
  this->_domain = '\0';
  this->_country = 0;
  this->_category = '\0';
  this->_subcategory = '\0';
  this->_specific = '\0';
  this->_extra = '\0';
  this->_altEntityKind = '\0';
  this->_altDomain = '\0';
  this->_altCountry = 0;
  this->_altCategory = '\0';
  this->_altSubcategory = '\0';
  this->_altSpecific = '\0';
  this->_altExtra = '\0';
  this->_xVelocity = 0.0;
  this->_yVelocity = 0.0;
  *(undefined8 *)&this->_zVelocity = 0;
  *(undefined8 *)((long)&this->_xLocation + 4) = 0;
  *(undefined8 *)((long)&this->_yLocation + 4) = 0;
  *(undefined8 *)((long)&this->_zLocation + 4) = 0;
  *(undefined8 *)((long)&this->_psi + 1) = 0;
  *(undefined8 *)((long)&this->_phi + 1) = 0;
  this->_xAcceleration = 0.0;
  this->_yAcceleration = 0.0;
  this->_zAcceleration = 0.0;
  this->_xAngularVelocity = 0.0;
  this->_yAngularVelocity = 0.0;
  this->_zAngularVelocity = 0.0;
  *(undefined8 *)&this->_capabilities = 0;
  *(undefined8 *)
   ((long)&(this->_variableParameters).
           super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->_variableParameters).
  super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_variableParameters).
  super__Vector_base<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PduSuperclass::setPduType((PduSuperclass *)this,'\x01');
  this->_otherParameters[7] = '\0';
  this->_otherParameters[8] = '\0';
  this->_otherParameters[9] = '\0';
  this->_otherParameters[10] = '\0';
  this->_otherParameters[0xb] = '\0';
  this->_otherParameters[0xc] = '\0';
  this->_otherParameters[0xd] = '\0';
  this->_otherParameters[0xe] = '\0';
  this->_otherParameters[0] = '\0';
  this->_otherParameters[1] = '\0';
  this->_otherParameters[2] = '\0';
  this->_otherParameters[3] = '\0';
  this->_otherParameters[4] = '\0';
  this->_otherParameters[5] = '\0';
  this->_otherParameters[6] = '\0';
  this->_otherParameters[7] = '\0';
  this->_marking[0] = '\0';
  this->_marking[1] = '\0';
  this->_marking[2] = '\0';
  this->_marking[3] = '\0';
  this->_marking[4] = '\0';
  this->_marking[5] = '\0';
  this->_marking[6] = '\0';
  this->_marking[7] = '\0';
  this->_marking[8] = '\0';
  this->_marking[9] = '\0';
  this->_marking[10] = '\0';
  this->_marking[0xb] = '\0';
  return;
}

Assistant:

FastEntityStatePdu::FastEntityStatePdu() : EntityInformationFamilyPdu(),
   _site(0), 
   _application(0), 
   _entity(0), 
   _forceId(0), 
   _numberOfVariableParameters(0), 
   _entityKind(0), 
   _domain(0), 
   _country(0), 
   _category(0), 
   _subcategory(0), 
   _specific(0), 
   _extra(0), 
   _altEntityKind(0), 
   _altDomain(0), 
   _altCountry(0), 
   _altCategory(0), 
   _altSubcategory(0), 
   _altSpecific(0), 
   _altExtra(0), 
   _xVelocity(0.0), 
   _yVelocity(0.0), 
   _zVelocity(0.0), 
   _xLocation(0.0), 
   _yLocation(0.0), 
   _zLocation(0.0), 
   _psi(0.0), 
   _theta(0.0), 
   _phi(0.0), 
   _entityAppearance(0), 
   _deadReckoningAlgorithm(0), 
   _xAcceleration(0.0), 
   _yAcceleration(0.0), 
   _zAcceleration(0.0), 
   _xAngularVelocity(0.0), 
   _yAngularVelocity(0.0), 
   _zAngularVelocity(0.0), 
   _capabilities(0)
{
    setPduType( 1 );
     // Initialize fixed length array
     for(int lengthotherParameters= 0; lengthotherParameters < 15; lengthotherParameters++)
     {
         _otherParameters[lengthotherParameters] = 0;
     }

     // Initialize fixed length array
     for(int lengthmarking= 0; lengthmarking < 12; lengthmarking++)
     {
         _marking[lengthmarking] = 0;
     }

}